

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lennard.c
# Opt level: O0

void LJ_Update_Velocity(void)

{
  long lVar1;
  double *v;
  double *a;
  int natms;
  int ld;
  int hi;
  int lo;
  int p;
  int i;
  int *in_stack_00000070;
  int *in_stack_00000078;
  int in_stack_00000080;
  int in_stack_00000084;
  int *in_stack_000000b0;
  void *in_stack_000000b8;
  int *in_stack_000000c0;
  int *in_stack_000000c8;
  int in_stack_000000d4;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  GA_Sync();
  NGA_Distribution(in_stack_00000084,in_stack_00000080,in_stack_00000078,in_stack_00000070);
  NGA_Access(in_stack_000000d4,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
             in_stack_000000b0);
  NGA_Access(in_stack_000000d4,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
             in_stack_000000b0);
  for (local_8 = 0; local_8 < ((local_10 - local_c) + 1) / 3; local_8 = local_8 + 1) {
    for (local_4 = 0; local_4 < 3; local_4 = local_4 + 1) {
      lVar1 = (long)(local_8 * 3 + local_4);
      *(double *)(local_28 + lVar1 * 8) =
           *(double *)(local_20 + (long)(local_8 * 3 + local_4) * 8) * 0.5 * gTimeStep +
           *(double *)(local_28 + lVar1 * 8);
    }
  }
  GA_Sync();
  return;
}

Assistant:

void LJ_Update_Velocity() {
  int i, p, lo, hi, ld, natms;
  double *a, *v;
  
  GA_Sync();
  
  NGA_Distribution(g_V, gMe, &lo, &hi);
  NGA_Access(g_V, &lo, &hi, &v, &ld); 
  NGA_Access(g_G, &lo, &hi, &a, &ld); 
  
  natms = (hi-lo+1)/NDIM;
  for (p = 0; p < natms; p++)
    for (i = 0; i < NDIM; i++) 
      v[p*NDIM+i] += 0.5 * a[p*NDIM+i] * gTimeStep;

  GA_Sync();
}